

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall absl::lts_20250127::log_internal::LogMessage::SendToLog(LogMessage *this)

{
  LogMessageData *this_00;
  bool bVar1;
  undefined1 in_R8B;
  Span<absl::lts_20250127::LogSink_*> SVar2;
  Span<absl::lts_20250127::LogSink_*> extra_sinks;
  
  bVar1 = IsFatal(this);
  if (bVar1) {
    PrepareToDie(this);
  }
  this_00 = (this->data_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl;
  SVar2 = MakeSpan<absl::lts_20250127::InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
                    (&this_00->extra_sinks);
  extra_sinks.ptr_ = SVar2.len_;
  extra_sinks.len_._0_1_ =
       ((this->data_)._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
       ._M_head_impl)->extra_sinks_only;
  extra_sinks.len_._1_7_ = 0;
  LogToSinks((log_internal *)this_00,(LogEntry *)SVar2.ptr_,extra_sinks,(bool)in_R8B);
  bVar1 = IsFatal(this);
  if (!bVar1) {
    return;
  }
  Die(this);
}

Assistant:

void LogMessage::SendToLog() {
  if (IsFatal()) PrepareToDie();
  // Also log to all registered sinks, even if OnlyLogToStderr() is set.
  log_internal::LogToSinks(data_->entry, absl::MakeSpan(data_->extra_sinks),
                           data_->extra_sinks_only);
  if (IsFatal()) Die();
}